

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.hpp
# Opt level: O3

void __thiscall Object::Object(Object *this,Json *conf,BSDF *bsdf)

{
  value_t vVar1;
  bool bVar2;
  bool bVar3;
  Primitive *pPVar4;
  const_reference pvVar5;
  Transformed *this_00;
  Light *pLVar6;
  float fVar7;
  vec3f vVar8;
  const_iterator result;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  undefined1 local_70 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  this->emission = (Light *)0x0;
  this->primitive = (Primitive *)0x0;
  this->bsdf = bsdf;
  pPVar4 = newPrimitive(conf);
  this->primitive = pPVar4;
  local_68 = (_Base_ptr)0x0;
  uStack_60 = (pointer)0x0;
  local_58 = -0x8000000000000000;
  vVar1 = conf->m_type;
  local_70 = (undefined1  [8])conf;
  if (vVar1 == object) {
    local_68 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
               ::_M_find_tr<char[10],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                           *)(conf->m_value).object,(char (*) [10])"transform");
    vVar1 = conf->m_type;
LAB_0010c125:
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_90.m_it.array_iterator._M_current = (pointer)0x0;
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar1 == array) goto LAB_0010c152;
    if (vVar1 == object) {
      local_90.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_90.m_it.primitive_iterator.m_it = 1;
    }
  }
  else {
    if (vVar1 != array) {
      local_58 = 1;
      goto LAB_0010c125;
    }
    uStack_60 = (((conf->m_value).array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
LAB_0010c152:
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_90.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_90.m_object = conf;
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_70,&local_90);
  if (!bVar2) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"transform");
    parseTransform((mat4f *)local_70,pvVar5);
    if (((float)local_70._0_4_ == 1.0) && (!NAN((float)local_70._0_4_))) {
      if (((float)local_70._4_4_ == 0.0) && (!NAN((float)local_70._4_4_))) {
        if (((float)local_68 == 0.0) && (!NAN((float)local_68))) {
          if ((local_68._4_4_ == 0.0) && (!NAN(local_68._4_4_))) {
            if (((float)uStack_60 == 0.0) && (!NAN((float)uStack_60))) {
              if ((uStack_60._4_4_ == 1.0) && (!NAN(uStack_60._4_4_))) {
                if (((float)local_58 == 0.0) && (!NAN((float)local_58))) {
                  if ((local_58._4_4_ == 0.0) &&
                     (((((((!NAN(local_58._4_4_) && (local_50 == 0.0)) && (!NAN(local_50))) &&
                         ((local_4c == 0.0 && (!NAN(local_4c))))) &&
                        ((local_48 == 1.0 && ((!NAN(local_48) && (local_44 == 0.0)))))) &&
                       (!NAN(local_44))) &&
                      ((((local_40 == 0.0 && (!NAN(local_40))) && (local_3c == 0.0)) &&
                       (((!NAN(local_3c) && (local_38 == 0.0)) &&
                        ((!NAN(local_38) && ((local_34 == 1.0 && (!NAN(local_34)))))))))))))
                  goto LAB_0010c2de;
                }
              }
            }
          }
        }
      }
    }
    pPVar4 = this->primitive;
    this_00 = (Transformed *)operator_new(0xa8);
    Transformed::Transformed(this_00,pPVar4,(mat4f *)local_70);
    this->primitive = (Primitive *)this_00;
  }
LAB_0010c2de:
  local_68 = (_Base_ptr)0x0;
  uStack_60 = (pointer)0x0;
  local_58 = -0x8000000000000000;
  vVar1 = conf->m_type;
  if (vVar1 == object) {
    local_70 = (undefined1  [8])conf;
    local_68 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
               ::_M_find_tr<char[9],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                           *)(conf->m_value).object,(char (*) [9])"emission");
    vVar1 = conf->m_type;
LAB_0010c343:
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_90.m_it.array_iterator._M_current = (pointer)0x0;
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar1 == array) goto LAB_0010c370;
    if (vVar1 == object) {
      local_90.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_90.m_it.primitive_iterator.m_it = 1;
    }
  }
  else {
    if (vVar1 != array) {
      local_58 = 1;
      local_70 = (undefined1  [8])conf;
      goto LAB_0010c343;
    }
    uStack_60 = (((conf->m_value).array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_70 = (undefined1  [8])conf;
LAB_0010c370:
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_90.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_90.m_object = conf;
  bVar2 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_70,&local_90);
  if (bVar2) {
    return;
  }
  local_68 = (_Base_ptr)0x0;
  uStack_60 = (pointer)0x0;
  local_58 = -0x8000000000000000;
  vVar1 = conf->m_type;
  if (vVar1 == object) {
    local_70 = (undefined1  [8])conf;
    local_68 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
               ::_M_find_tr<char[7],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                           *)(conf->m_value).object,(char (*) [7])"sample");
    vVar1 = conf->m_type;
LAB_0010c404:
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_90.m_it.array_iterator._M_current = (pointer)0x0;
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar1 == array) goto LAB_0010c431;
    if (vVar1 == object) {
      local_90.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_90.m_it.primitive_iterator.m_it = 1;
    }
  }
  else {
    if (vVar1 != array) {
      local_58 = 1;
      local_70 = (undefined1  [8])conf;
      goto LAB_0010c404;
    }
    uStack_60 = (((conf->m_value).array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_70 = (undefined1  [8])conf;
LAB_0010c431:
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_90.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_90.m_object = conf;
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_70,&local_90);
  bVar2 = true;
  if (!bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"sample");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar5,(boolean_t *)local_70);
    bVar2 = local_70[0];
  }
  local_68 = (_Base_ptr)0x0;
  uStack_60 = (pointer)0x0;
  local_58 = -0x8000000000000000;
  vVar1 = conf->m_type;
  if (vVar1 == object) {
    local_70 = (undefined1  [8])conf;
    local_68 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
               ::_M_find_tr<char[13],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                           *)(conf->m_value).object,(char (*) [13])"sampled_side");
    vVar1 = conf->m_type;
LAB_0010c4e6:
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_90.m_it.array_iterator._M_current = (pointer)0x0;
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar1 != array) {
      if (vVar1 == object) {
        local_90.m_it.object_iterator._M_node =
             &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        local_90.m_it.primitive_iterator.m_it = 1;
      }
      goto LAB_0010c52b;
    }
  }
  else {
    if (vVar1 != array) {
      local_58 = 1;
      local_70 = (undefined1  [8])conf;
      goto LAB_0010c4e6;
    }
    uStack_60 = (((conf->m_value).array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_70 = (undefined1  [8])conf;
  }
  local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_90.m_it.array_iterator._M_current =
       (((conf->m_value).array)->
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
LAB_0010c52b:
  local_90.m_object = conf;
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_70,&local_90);
  fVar7 = 0.0;
  if (!bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"sampled_side");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
              (pvVar5,(int *)local_70);
    fVar7 = (float)local_70._0_4_;
  }
  pLVar6 = (Light *)operator_new(0x28);
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"emission");
  vVar8 = json2vec3f(pvVar5);
  pPVar4 = this->primitive;
  pLVar6->samplable = bVar2;
  pLVar6->_vptr_Light = (_func_int **)&PTR_sampleIrradiance_00169bb0;
  *(long *)&pLVar6->field_0xc = vVar8._0_8_;
  *(float *)((long)&pLVar6[1]._vptr_Light + 4) = vVar8.z;
  *(Primitive **)&pLVar6[1].samplable = pPVar4;
  *(float *)&pLVar6[2]._vptr_Light = fVar7;
  this->emission = pLVar6;
  return;
}

Assistant:

Object(const Json& conf, BSDF* bsdf)
	{
		this->bsdf = bsdf;
		primitive = newPrimitive(conf);
		// apply transform
		if (conf.find("transform") != conf.end())
		{
			mat4f m = parseTransform(conf["transform"]);
			if (m != mat4f::unit) {
				Primitive* t = primitive;
				primitive = new Transformed(t, m);
			}
		}
		// apply emission
		if (conf.find("emission") != conf.end()) {
			bool samplable = true;
			if (conf.find("sample") != conf.end()) {
				samplable = conf["sample"];
			}
			int sampled_side = 0;
			if (conf.find("sampled_side") != conf.end()) {
				sampled_side = conf["sampled_side"];
			}
			this->emission = new DiffuseLight(samplable, json2vec3f(conf["emission"]), primitive, sampled_side);
		}
	}